

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double __thiscall
baryonyx::itm::quadratic_cost_type<float>::results
          (quadratic_cost_type<float> *this,bit_array *x,double cost_constant)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int local_2c;
  int e_1;
  int i_1;
  int e;
  int i;
  double cost_constant_local;
  bit_array *x_local;
  quadratic_cost_type<float> *this_local;
  
  i_1 = 0;
  iVar1 = length<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                    (&this->obj->elements);
  _e = cost_constant;
  for (; i_1 != iVar1; i_1 = i_1 + 1) {
    pvVar3 = std::
             vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ::operator[](&this->obj->elements,(long)i_1);
    iVar2 = bit_array::operator[](x,pvVar3->variable_index);
    if (iVar2 != 0) {
      pvVar3 = std::
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ::operator[](&this->obj->elements,(long)i_1);
      _e = pvVar3->factor + _e;
    }
  }
  local_2c = 0;
  iVar1 = length<std::vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>>
                    (&this->obj->qelements);
  for (; local_2c != iVar1; local_2c = local_2c + 1) {
    pvVar4 = std::
             vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ::operator[](&this->obj->qelements,(long)local_2c);
    iVar2 = bit_array::operator[](x,pvVar4->variable_index_a);
    if (iVar2 != 0) {
      pvVar4 = std::
               vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ::operator[](&this->obj->qelements,(long)local_2c);
      iVar2 = bit_array::operator[](x,pvVar4->variable_index_b);
      if (iVar2 != 0) {
        pvVar4 = std::
                 vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ::operator[](&this->obj->qelements,(long)local_2c);
        _e = pvVar4->factor + _e;
      }
    }
  }
  return _e;
}

Assistant:

double results(const bit_array& x, double cost_constant) const noexcept
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i)
            if (x[obj.elements[i].variable_index])
                cost_constant += obj.elements[i].factor;

        for (int i = 0, e = length(obj.qelements); i != e; ++i)
            if (x[obj.qelements[i].variable_index_a] &&
                x[obj.qelements[i].variable_index_b])
                cost_constant += obj.qelements[i].factor;

        return cost_constant;
    }